

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_read1(BGZF *fp,bam1_t *b)

{
  ssize_t sVar1;
  void *pvVar2;
  int32_t local_58 [2];
  uint32_t x [8];
  int32_t i;
  int32_t ret;
  int32_t block_len;
  bam1_core_t *c;
  bam1_t *b_local;
  BGZF *fp_local;
  
  _ret = b;
  c = &b->core;
  b_local = (bam1_t *)fp;
  sVar1 = bgzf_read(fp,&i,4);
  if ((int)sVar1 == 4) {
    sVar1 = bgzf_read((BGZF *)b_local,local_58,0x20);
    if (sVar1 == 0x20) {
      if (((b_local->core).tid << 0xc) >> 0x1e != 0) {
        ed_swap_4p(&i);
        for (x[7] = 0; (int)x[7] < 8; x[7] = x[7] + 1) {
          ed_swap_4p(local_58 + (int)x[7]);
        }
      }
      (_ret->core).tid = local_58[0];
      (_ret->core).pos = local_58[1];
      *(ulong *)&(_ret->core).field_0x8 =
           *(ulong *)&(_ret->core).field_0x8 & 0xffffffffffff0000 | (ulong)(x[0] >> 0x10);
      *(ulong *)&(_ret->core).field_0x8 =
           *(ulong *)&(_ret->core).field_0x8 & 0xffffffffff00ffff |
           (ulong)(x[0] >> 8 & 0xff) << 0x10;
      *(ulong *)&(_ret->core).field_0x8 =
           *(ulong *)&(_ret->core).field_0x8 & 0xffffffff00ffffff | (ulong)(x[0] & 0xff) << 0x18;
      *(ulong *)&(_ret->core).field_0x8 =
           *(ulong *)&(_ret->core).field_0x8 & 0xffff0000ffffffff | (ulong)(x[1] >> 0x10) << 0x20;
      *(ulong *)&(_ret->core).field_0x8 =
           *(ulong *)&(_ret->core).field_0x8 & 0xffffffffffff | (ulong)(x[1] & 0xffff) << 0x30;
      (_ret->core).l_qseq = x[2];
      (_ret->core).mtid = x[3];
      (_ret->core).mpos = x[4];
      (_ret->core).isize = x[5];
      c[1].tid = i + -0x20;
      if ((c[1].tid < 0) || ((_ret->core).l_qseq < 0)) {
        fp_local._4_4_ = -4;
      }
      else if ((long)c[1].tid <
               (*(long *)&c[1].field_0x8 +
                (long)(int)((uint)(ushort)((ulong)*(undefined8 *)&c->field_0x8 >> 0x30) << 2) +
                (long)(int)((uint)((ulong)*(undefined8 *)&c->field_0x8 >> 0x18) & 0xff) +
                (long)(c->l_qseq + 1 >> 1) + (long)c->l_qseq) - *(long *)&c[1].field_0x8) {
        fp_local._4_4_ = -4;
      }
      else {
        if (c[1].pos < c[1].tid) {
          c[1].pos = c[1].tid;
          c[1].pos = c[1].pos + -1;
          c[1].pos = c[1].pos >> 1 | c[1].pos;
          c[1].pos = c[1].pos >> 2 | c[1].pos;
          c[1].pos = c[1].pos >> 4 | c[1].pos;
          c[1].pos = c[1].pos >> 8 | c[1].pos;
          c[1].pos = c[1].pos >> 0x10 | c[1].pos;
          c[1].pos = c[1].pos + 1;
          pvVar2 = realloc(*(void **)&c[1].field_0x8,(long)c[1].pos);
          *(void **)&c[1].field_0x8 = pvVar2;
          if (*(long *)&c[1].field_0x8 == 0) {
            return -4;
          }
        }
        sVar1 = bgzf_read((BGZF *)b_local,*(void **)&c[1].field_0x8,(long)c[1].tid);
        if (sVar1 == c[1].tid) {
          if (((b_local->core).tid << 0xc) >> 0x1e != 0) {
            swap_data(&_ret->core,c[1].tid,*(uint8_t **)&c[1].field_0x8,0);
          }
          fp_local._4_4_ = i + 4;
        }
        else {
          fp_local._4_4_ = -4;
        }
      }
    }
    else {
      fp_local._4_4_ = -3;
    }
  }
  else if ((int)sVar1 == 0) {
    fp_local._4_4_ = -1;
  }
  else {
    fp_local._4_4_ = -2;
  }
  return fp_local._4_4_;
}

Assistant:

int bam_read1(BGZF *fp, bam1_t *b)
{
    bam1_core_t *c = &b->core;
    int32_t block_len, ret, i;
    uint32_t x[8];
    if ((ret = bgzf_read(fp, &block_len, 4)) != 4) {
        if (ret == 0) return -1; // normal end-of-file
        else return -2; // truncated
    }
    if (bgzf_read(fp, x, 32) != 32) return -3;
    if (fp->is_be) {
        ed_swap_4p(&block_len);
        for (i = 0; i < 8; ++i) ed_swap_4p(x + i);
    }
    c->tid = x[0]; c->pos = x[1];
    c->bin = x[2]>>16; c->qual = x[2]>>8&0xff; c->l_qname = x[2]&0xff;
    c->flag = x[3]>>16; c->n_cigar = x[3]&0xffff;
    c->l_qseq = x[4];
    c->mtid = x[5]; c->mpos = x[6]; c->isize = x[7];
    b->l_data = block_len - 32;
    if (b->l_data < 0 || c->l_qseq < 0) return -4;
    if ((char *)bam_get_aux(b) - (char *)b->data > b->l_data)
        return -4;
    if (b->m_data < b->l_data) {
        b->m_data = b->l_data;
        kroundup32(b->m_data);
        b->data = (uint8_t*)realloc(b->data, b->m_data);
        if (!b->data)
            return -4;
    }
    if (bgzf_read(fp, b->data, b->l_data) != b->l_data) return -4;
    //b->l_aux = b->l_data - c->n_cigar * 4 - c->l_qname - c->l_qseq - (c->l_qseq+1)/2;
    if (fp->is_be) swap_data(c, b->l_data, b->data, 0);
    return 4 + block_len;
}